

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O1

void * TPZParFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
       ::GlobalAssemble(void *t)

{
  TPZCompEl *pTVar1;
  bool bVar2;
  TPZCompEl **ppTVar3;
  long *plVar4;
  long lVar5;
  TPZElementMatrix *pTVar6;
  TPZElementMatrix *pTVar7;
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
  *pTVar8;
  long lVar9;
  long lVar10;
  ostream *poVar11;
  int iVar12;
  long lVar13;
  unique_lock<std::mutex> global_lock;
  TPZElementMatrix *local_88;
  TPZElementMatrix *local_80;
  unique_lock<std::mutex> local_78;
  long local_68;
  TPZCompEl *local_60;
  TPZChunkVector<TPZCompEl_*,_10> *local_58;
  TPZStack<TPZElementMatrix_*,_10> *local_50;
  TPZStack<TPZElementMatrix_*,_10> *local_48;
  TPZStack<long,_10> *local_40;
  long local_38;
  
  lVar9 = *(long *)((long)t + 0xe0);
  lVar10 = *(long *)((long)t + 0xe8);
  if (lVar9 < lVar10) {
    local_58 = (TPZChunkVector<TPZCompEl_*,_10> *)(*(long *)((long)t + 8) + 0x40);
    local_68 = (long)t + 0x20;
    local_40 = (TPZStack<long,_10> *)((long)t + 0x108);
    local_50 = (TPZStack<TPZElementMatrix_*,_10> *)((long)t + 0x1e8);
    local_48 = (TPZStack<TPZElementMatrix_*,_10> *)((long)t + 0x178);
    do {
      iVar12 = (int)(SUB168(SEXT816(lVar10) * ZEXT816(0xa3d70a3d70a3d70b),8) >> 7) -
               (SUB164(SEXT816(lVar10) * ZEXT816(0xa3d70a3d70a3d70b),0xc) >> 0x1f);
      if (lVar10 + 199U < 399) {
        iVar12 = 1;
      }
      if (lVar9 % (long)iVar12 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"*",1);
      }
      std::ostream::flush();
      if ((*(long *)((long)t + 0xe0) != 0) &&
         (*(long *)((long)t + 0xe0) % (long)(iVar12 * 0x14) == 0)) {
        if (*(long *)((long)t + 0xd8) == *(long *)((long)t + 0xe8)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          poVar11 = (ostream *)&std::cout;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Element ",9);
          poVar11 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          poVar11 = std::ostream::_M_insert<long>((long)poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"% Elements computed ",0x14);
        }
        poVar11 = std::ostream::_M_insert<long>((long)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"% Elements assembled ",0x15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        std::ostream::flush();
      }
      lVar9 = *(long *)((long)t + 0xe0);
      *(long *)((long)t + 0xe0) = lVar9 + 1;
      lVar10 = (long)*(int *)(*(long *)((long)t + 0xb0) + lVar9 * 4);
      if (-1 < lVar10) {
        ppTVar3 = TPZChunkVector<TPZCompEl_*,_10>::operator[](local_58,lVar10);
        pTVar1 = *ppTVar3;
        if (pTVar1 != (TPZCompEl *)0x0) {
          plVar4 = (long *)(**(code **)(*(long *)pTVar1 + 0xb8))(pTVar1);
          if (plVar4 == (long *)0x0) {
            lVar10 = __dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
            lVar13 = __dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZElementGroup::typeinfo,0);
            lVar5 = __dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZCondensedCompEl::typeinfo,0);
            if (((lVar10 == 0) && (lVar13 == 0)) && (lVar5 == 0)) goto LAB_013a52dd;
          }
          else {
            iVar12 = (**(code **)(*plVar4 + 0x58))(plVar4);
            if (*(int *)((long)t + 0x40) != 0) {
              lVar13 = local_68;
              for (lVar10 = *(long *)((long)t + 0x28); lVar10 != 0;
                  lVar10 = *(long *)(lVar10 + 0x10 + (ulong)(*(int *)(lVar10 + 0x20) < iVar12) * 8))
              {
                if (iVar12 <= *(int *)(lVar10 + 0x20)) {
                  lVar13 = lVar10;
                }
              }
              lVar10 = local_68;
              if ((lVar13 != local_68) && (lVar10 = lVar13, iVar12 < *(int *)(lVar13 + 0x20))) {
                lVar10 = local_68;
              }
              if (lVar10 == local_68) goto LAB_013a52dd;
            }
          }
          local_78._M_device = &mutex_global_assemble;
          local_78._M_owns = false;
          local_60 = pTVar1;
          std::unique_lock<std::mutex>::lock(&local_78);
          local_78._M_owns = true;
          if (lVar9 != -1) {
            lVar10 = -1;
            local_88 = (TPZElementMatrix *)0x0;
            local_80 = (TPZElementMatrix *)0x0;
            do {
              lVar13 = 0;
              if (0 < *(long *)((long)t + 0x118)) {
                do {
                  lVar5 = *(long *)(*(long *)((long)t + 0x110) + lVar13 * 8);
                  if (lVar5 == lVar9) {
                    local_88 = *(TPZElementMatrix **)(*(long *)((long)t + 0x180) + lVar13 * 8);
                    local_80 = *(TPZElementMatrix **)(*(long *)((long)t + 0x1f0) + lVar13 * 8);
                    local_38 = TPZStack<long,_10>::Pop(local_40);
                    pTVar6 = TPZStack<TPZElementMatrix_*,_10>::Pop(local_48);
                    pTVar7 = TPZStack<TPZElementMatrix_*,_10>::Pop(local_50);
                    if (*(long *)((long)t + 0x118) < (long)*(int *)((long)t + 0xf0)) {
                      std::condition_variable::notify_all();
                    }
                    lVar10 = lVar5;
                    if (lVar13 < *(long *)((long)t + 0x118)) {
                      *(long *)(*(long *)((long)t + 0x110) + lVar13 * 8) = local_38;
                      *(TPZElementMatrix **)(*(long *)((long)t + 0x180) + lVar13 * 8) = pTVar6;
                      *(TPZElementMatrix **)(*(long *)((long)t + 0x1f0) + lVar13 * 8) = pTVar7;
                    }
                    break;
                  }
                  lVar13 = lVar13 + 1;
                } while (*(long *)((long)t + 0x118) != lVar13);
              }
              if (lVar10 == lVar9) goto LAB_013a523d;
              std::condition_variable::wait((unique_lock *)condassemble);
            } while( true );
          }
          local_80 = (TPZElementMatrix *)0x0;
          local_88 = (TPZElementMatrix *)0x0;
LAB_013a523d:
          std::unique_lock<std::mutex>::~unique_lock(&local_78);
          TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
          ::AssembleElement((TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
                             *)t,local_60,local_88,local_80,
                            *(TPZMatrix<std::complex<double>_> **)((long)t + 0xf8),
                            *(TPZFMatrix<std::complex<double>_> **)((long)t + 0x100));
          if (*(long *)((long)t + 0xe0) == *(long *)((long)t + 0xe8)) {
            pTVar8 = (TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
                      *)__dynamic_cast(*(undefined8 *)((long)t + 0xf8),
                                       &TPZMatrix<std::complex<double>>::typeinfo,
                                       &TPZParFrontMatrix<std::complex<double>,TPZFileEqnStorage<std::complex<double>>,TPZFrontNonSym<std::complex<double>>>
                                        ::typeinfo,0);
            TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
            ::FinishWriting(pTVar8);
          }
          (*local_88->_vptr_TPZElementMatrix[1])(local_88);
          (*local_80->_vptr_TPZElementMatrix[1])(local_80);
          plVar4 = *(long **)((long)t + 0xd0);
          if (((plVar4 != (long *)0x0) && (*plVar4 != 0)) &&
             (bVar2 = TPZGuiInterface::AmIKilled((TPZGuiInterface *)*plVar4), bVar2)) {
            pTVar8 = (TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
                      *)__dynamic_cast(*(undefined8 *)((long)t + 0xf8),
                                       &TPZMatrix<std::complex<double>>::typeinfo,
                                       &TPZParFrontMatrix<std::complex<double>,TPZFileEqnStorage<std::complex<double>>,TPZFrontNonSym<std::complex<double>>>
                                        ::typeinfo,0);
            TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
            ::FinishWriting(pTVar8);
            break;
          }
        }
      }
LAB_013a52dd:
      lVar9 = *(long *)((long)t + 0xe0);
      lVar10 = *(long *)((long)t + 0xe8);
    } while (lVar9 < lVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Matrix assembled\n",0x11);
  std::ostream::flush();
  return (void *)0x0;
}

Assistant:

void *TPZParFrontStructMatrix<TFront,TVar,TPar>::GlobalAssemble(void *t){
    
	TPZParFrontStructMatrix<TFront,TVar,TPar> *parfront = (TPZParFrontStructMatrix<TFront,TVar,TPar> *) t;
	TPZAdmChunkVector<TPZCompEl *> &elementvec = parfront->fMesh->ElementVec();
	while(parfront->fCurrentAssembled < parfront->fNElements) {
		
#ifndef USING_ATLAS
        const int unit = (parfront->fNElements/200 == 0 ? 1 : parfront->fNElements/200);
        if(!(parfront->fCurrentAssembled%unit))std::cout << "*";
		std::cout.flush();
		if(!(parfront->fCurrentAssembled%(20*unit)) && parfront->fCurrentAssembled)
        {
			if(parfront->fCurrentElement!=parfront->fNElements){
				std::cout << " Element " << parfront->fCurrentElement << " " << (100*parfront->fCurrentElement/parfront->fNElements) << "% Elements computed " << (100*parfront->fCurrentAssembled/parfront->fNElements) << "% Elements assembled " << std::endl;
				std::cout.flush();
			}else{
				std::cout << " " << (100*parfront->fCurrentAssembled/parfront->fNElements) << "% Elements assembled " << std::endl;
				std::cout.flush();
			}
		}
#endif
		/**
		 *Lock mutex and search for an available element
		 *A global variable to be updated whenever a element is processed
		 */
		
		//Lock a mutex and get an element number
		int64_t local_element = parfront->fCurrentAssembled;
		parfront->fCurrentAssembled++;
		
		if(parfront->fElementOrder[local_element] < 0) continue;
		TPZCompEl *el = elementvec[parfront->fElementOrder[local_element]];
		if(!el) continue;
		TPZMaterial * mat = el->Material();
		if(mat)
		{
			int matid = mat->Id();
			if(parfront->ShouldCompute(matid) == false)
			{
				continue;
			}
		}
		else 
		{
			TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *> (el);
            TPZElementGroup *elgrp = dynamic_cast<TPZElementGroup *>(el);
            TPZCondensedCompEl *condel = dynamic_cast<TPZCondensedCompEl *>(el);
			if(!submesh && ! elgrp && ! condel)
			{
				continue;
			}
		}
		
		//Searches for next element
		int64_t i=0;
		int64_t aux = -1;
		TPZElementMatrix *ekaux = 0, *efaux = 0;
        {
            std::unique_lock<std::mutex> global_lock(mutex_global_assemble);
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Acquired mutex_global_assemble";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            while(aux != local_element){
                while(i < parfront->felnum.NElements()) {
                    if(parfront->felnum[i] == local_element){
                        TPZElementMatrix *ektemp, *eftemp;
                        aux = parfront->felnum[i];
                        ekaux = parfront->fekstack[i];
                        efaux = parfront->fefstack[i];
                        int64_t itemp = parfront->felnum.Pop();
                        ektemp = parfront->fekstack.Pop();
                        eftemp = parfront->fefstack.Pop();
                        if(parfront->felnum.NElements()<parfront->fMaxStackSize){
                            stackfull.notify_all();
                        }
                        if(i < parfront->felnum.NElements()) {
                            
                            parfront->felnum[i] = itemp;
                            parfront->fekstack[i]=ektemp;
                            parfront->fefstack[i]=eftemp;
                        }
                        break;
                    }
                    i++;
                }
                if(aux!=local_element){
                    i=0;
    #ifdef PZ_LOG
                    if (logger.isDebugEnabled())
                    {
                        std::stringstream sout;
                        sout << "Waiting on condassemble";
                        LOGPZ_DEBUG(logger,sout.str())
                    }
    #endif
                    condassemble.wait(global_lock);
                }
            }
    #ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Unlocking mutex_global_assemble";
                LOGPZ_DEBUG(logger,sout.str())
            }
    #endif
            // global_lock is being destroyed...
        }
		parfront->AssembleElement(el, *ekaux, *efaux, *parfront->fStiffness, *parfront->fRhs);
		if(parfront->fCurrentAssembled == parfront->fNElements)
		{
#ifdef STACKSTORAGE
            TPZParFrontMatrix<TVar,TPZStackEqnStorage<TVar>, TFront> *mat = dynamic_cast< TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, front>* > (parfront->fStiffness);
#else
            TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>* > (parfront->fStiffness);
            
#endif
			mat->FinishWriting();
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "fFinishedComputing set to 1";
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
		}
		
		delete ekaux;
		delete efaux;
		
		if(parfront->fGuiInterface) if(parfront->fGuiInterface->AmIKilled()){
#ifdef STACKSTORAGE
			TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, front> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, front>* > (parfront->fStiffness);
#else
            TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>* > (parfront->fStiffness);
            
#endif
			mat->FinishWriting();
			break;
		}
		
		
	}//fim for iel
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Terminating assemble thread";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	std::cout << "Matrix assembled\n";
	std::cout.flush();

	return 0;
}